

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Promise<void> __thiscall
capnproto_test::capnp::test::TestKeywordMethods::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::TestKeywordMethods::DeleteParams,_capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>
  CVar1;
  CallContext<capnproto_test::capnp::test::TestKeywordMethods::ClassParams,_capnproto_test::capnp::test::TestKeywordMethods::ClassResults>
  CVar2;
  CallContext<capnproto_test::capnp::test::TestKeywordMethods::VoidParams,_capnproto_test::capnp::test::TestKeywordMethods::VoidResults>
  CVar3;
  CallContext<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams,_capnproto_test::capnp::test::TestKeywordMethods::ReturnResults>
  CVar4;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  undefined6 in_register_00000032;
  long *plVar6;
  Promise<void> PVar7;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  PromiseNode *pPVar5;
  
  plVar6 = (long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffff) {
  case 0:
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestKeywordMethods::DeleteParams,capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 8))(this,plVar6,CVar1.hook);
    pPVar5 = extraout_RDX;
    break;
  case 1:
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestKeywordMethods::ClassParams,capnproto_test::capnp::test::TestKeywordMethods::ClassResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x10))(this,plVar6,CVar2.hook);
    pPVar5 = extraout_RDX_00;
    break;
  case 2:
    CVar3 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestKeywordMethods::VoidParams,capnproto_test::capnp::test::TestKeywordMethods::VoidResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x18))(this,plVar6,CVar3.hook);
    pPVar5 = extraout_RDX_01;
    break;
  case 3:
    CVar4 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams,capnproto_test::capnp::test::TestKeywordMethods::ReturnResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x20))(this,plVar6,CVar4.hook);
    pPVar5 = extraout_RDX_02;
    break;
  default:
    PVar7 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),0xa91fb3,
                       0x7cfc);
    pPVar5 = PVar7.super_PromiseBase.node.ptr;
  }
  PVar7.super_PromiseBase.node.ptr = pPVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestKeywordMethods::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return delete_(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestKeywordMethods::DeleteParams,  ::capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>(context));
    case 1:
      return class_(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestKeywordMethods::ClassParams,  ::capnproto_test::capnp::test::TestKeywordMethods::ClassResults>(context));
    case 2:
      return void_(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestKeywordMethods::VoidParams,  ::capnproto_test::capnp::test::TestKeywordMethods::VoidResults>(context));
    case 3:
      return return_(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestKeywordMethods::ReturnParams,  ::capnproto_test::capnp::test::TestKeywordMethods::ReturnResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestKeywordMethods",
          0x9ae342d394247cfcull, methodId);
  }
}